

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine.cpp
# Opt level: O2

void __thiscall QPaintEngine::drawTextItem(QPaintEngine *this,QPointF *p,QTextItem *textItem)

{
  qreal dx;
  double dVar1;
  undefined4 uVar2;
  long *plVar3;
  int iVar4;
  RenderHints RVar5;
  StyleStrategy SVar6;
  QPainter *pQVar7;
  QPainter *pQVar8;
  QFont *pQVar9;
  long lVar10;
  long lVar11;
  qreal *pqVar12;
  undefined8 *puVar13;
  QTransform *pQVar14;
  undefined8 *puVar15;
  int i;
  long in_FS_OFFSET;
  bool bVar16;
  byte bVar17;
  undefined8 local_d40;
  QImage local_d38;
  undefined4 local_d18;
  undefined2 local_d14;
  undefined8 local_d12;
  undefined8 local_d08 [9];
  ushort local_cc0;
  QTransform matrix;
  QVarLengthArray<unsigned_int,_256LL> local_c68;
  QPainterPath path;
  int local_838 [512];
  long local_38;
  
  bVar17 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(textItem + 0x70) != 0) {
    plVar3 = *(long **)(textItem + 0x78);
    if ((int)plVar3[0x19] == 4) {
      memset(local_838,0xaa,0x800);
      path.d_ptr.d.ptr =
           (QExplicitlySharedDataPointer<QPainterPathPrivate>)
           (totally_ordered_wrapper<QPainterPathPrivate_*>)0x100;
      memset(&local_c68.super_QVLAStorage<4UL,_4UL,_256LL>,0xaa,0x400);
      local_c68.super_QVLABase<unsigned_int>.super_QVLABaseBase.a = 0x100;
      local_c68.super_QVLABase<unsigned_int>.super_QVLABaseBase.s = 0;
      pqVar12 = (qreal *)&DAT_005ec460;
      pQVar14 = &matrix;
      local_c68.super_QVLABase<unsigned_int>.super_QVLABaseBase.ptr =
           &local_c68.super_QVLAStorage<4UL,_4UL,_256LL>;
      for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
        pQVar14->m_matrix[0][0] = *pqVar12;
        pqVar12 = pqVar12 + (ulong)bVar17 * -2 + 1;
        pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar17 * -2 + 1) * 8);
      }
      dx = p->xp;
      dVar1 = p->yp;
      iVar4 = (**(code **)(*plVar3 + 0xf0))(plVar3);
      QTransform::fromTranslate(&matrix,dx,(double)iVar4 * -0.015625 + dVar1);
      QFontEngine::getGlyphPositions
                (*(QFontEngine **)(textItem + 0x78),(QGlyphLayout *)(textItem + 0x48),&matrix,
                 (QFlagsStorageHelper<QTextItem::RenderFlag,_4>)
                 *(QFlagsStorage<QTextItem::RenderFlag> *)(textItem + 0xc),&local_c68,
                 (QVarLengthArray<QFixedPoint,_256LL> *)&path);
      pQVar7 = painter(this);
      QPainter::save(pQVar7);
      pQVar7 = painter(this);
      pQVar8 = painter(this);
      RVar5 = QPainter::renderHints(pQVar8);
      if (((uint)RVar5.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
                 super_QFlagsStorage<QPainter::RenderHint>.i & 2) == 0) {
        bVar16 = false;
      }
      else {
        pQVar8 = painter(this);
        pQVar9 = QPainter::font(pQVar8);
        SVar6 = QFont::styleStrategy(pQVar9);
        bVar16 = (SVar6 >> 8 & 1) == 0;
      }
      QPainter::setRenderHint(pQVar7,SmoothPixmapTransform,bVar16);
      for (lVar10 = 0; lVar10 < *(int *)(textItem + 0x70); lVar10 = lVar10 + 1) {
        local_d38.d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
        local_d38.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0xaaaaaaaa;
        local_d38.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0xaaaaaaaa;
        local_d38.super_QPaintDevice.painters = 0xaaaa;
        local_d38.super_QPaintDevice._10_2_ = 0xaaaa;
        local_d38.super_QPaintDevice._12_4_ = 0xaaaaaaaa;
        plVar3 = *(long **)(textItem + 0x78);
        uVar2 = *(undefined4 *)
                 ((char *)local_c68.super_QVLABase<unsigned_int>.super_QVLABaseBase.ptr + lVar10 * 4
                 );
        local_d40 = 0;
        puVar13 = &DAT_005ec4d8;
        puVar15 = local_d08;
        for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar15 = *puVar13;
          puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
          puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
        }
        local_cc0 = local_cc0 & 0xfc00;
        local_d18 = 0;
        local_d14 = 0xffff;
        local_d12 = 0;
        (**(code **)(*plVar3 + 0xb0))(&local_d38,plVar3,uVar2,&local_d40);
        pQVar7 = painter(this);
        QPainter::drawImage(pQVar7,(int)((double)local_838[lVar10 * 2] * 0.015625),
                            (int)((double)local_838[lVar10 * 2 + 1] * 0.015625),&local_d38,0,0,-1,-1
                            ,(ImageConversionFlags)0x0);
        QImage::~QImage(&local_d38);
      }
      pQVar7 = painter(this);
      QPainter::restore(pQVar7);
      QVarLengthArray<unsigned_int,_256LL>::~QVarLengthArray(&local_c68);
      QVarLengthArray<QFixedPoint,_256LL>::~QVarLengthArray
                ((QVarLengthArray<QFixedPoint,_256LL> *)&path);
    }
    else {
      path.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath(&path);
      QPainterPath::setFillRule(&path,WindingFill);
      (**(code **)(**(long **)(textItem + 0x78) + 0x80))
                (0,0,*(long **)(textItem + 0x78),(QGlyphLayout *)(textItem + 0x48),&path,
                 *(undefined4 *)(textItem + 0xc));
      bVar16 = QPainterPath::isEmpty(&path);
      if (!bVar16) {
        pQVar7 = painter(this);
        QPainter::save(pQVar7);
        pQVar7 = painter(this);
        pQVar8 = painter(this);
        RVar5 = QPainter::renderHints(pQVar8);
        if (((uint)RVar5.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
                   super_QFlagsStorage<QPainter::RenderHint>.i & 2) == 0) {
          bVar16 = false;
        }
        else {
          pQVar8 = painter(this);
          pQVar9 = QPainter::font(pQVar8);
          SVar6 = QFont::styleStrategy(pQVar9);
          bVar16 = (SVar6 >> 8 & 1) == 0;
        }
        QPainter::setRenderHint(pQVar7,Antialiasing,bVar16);
        pQVar7 = painter(this);
        QPainter::translate(pQVar7,p->xp,p->yp);
        pQVar7 = painter(this);
        pQVar8 = painter(this);
        QPainter::pen(pQVar8);
        QPen::brush((QPen *)&local_c68);
        QPainter::fillPath(pQVar7,&path,(QBrush *)&local_c68);
        QBrush::~QBrush((QBrush *)&local_c68);
        pQVar7 = painter(this);
        QPainter::restore(pQVar7);
      }
      QPainterPath::~QPainterPath(&path);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPaintEngine::drawTextItem(const QPointF &p, const QTextItem &textItem)
{
    const QTextItemInt &ti = static_cast<const QTextItemInt &>(textItem);
    if (ti.glyphs.numGlyphs == 0)
        return;

    if (ti.fontEngine->glyphFormat == QFontEngine::Format_ARGB) {
        QVarLengthArray<QFixedPoint> positions;
        QVarLengthArray<glyph_t> glyphs;
        QTransform matrix = QTransform::fromTranslate(p.x(), p.y() - ti.fontEngine->ascent().toReal());
        ti.fontEngine->getGlyphPositions(ti.glyphs, matrix, ti.flags, glyphs, positions);
        painter()->save();
        painter()->setRenderHint(QPainter::SmoothPixmapTransform,
                                 bool((painter()->renderHints() & QPainter::TextAntialiasing)
                                      && !(painter()->font().styleStrategy() & QFont::NoAntialias)));
        for (int i = 0; i < ti.glyphs.numGlyphs; ++i) {
            QImage glyph = ti.fontEngine->bitmapForGlyph(glyphs[i], QFixedPoint(), QTransform());
            painter()->drawImage(positions[i].x.toReal(), positions[i].y.toReal(), glyph);
        }
        painter()->restore();
        return;
    }

    QPainterPath path;
    path.setFillRule(Qt::WindingFill);
    ti.fontEngine->addOutlineToPath(0, 0, ti.glyphs, &path, ti.flags);
    if (!path.isEmpty()) {
        painter()->save();
        painter()->setRenderHint(QPainter::Antialiasing,
                                 bool((painter()->renderHints() & QPainter::TextAntialiasing)
                                      && !(painter()->font().styleStrategy() & QFont::NoAntialias)));
        painter()->translate(p.x(), p.y());
        painter()->fillPath(path, painter()->pen().brush());
        painter()->restore();
    }
}